

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int GaussPlane_F32(float *src,int src_stride,float *dst,int dst_stride,int width,int height)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float *pfVar3;
  uint uVar4;
  void *__ptr;
  float *src4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  float *src3;
  float *src1;
  float *src0;
  float *src2;
  ulong uVar9;
  
  iVar5 = -1;
  if ((height != 0 && 0 < width) && (dst != (float *)0x0 && src != (float *)0x0)) {
    uVar9 = (ulong)(uint)width;
    uVar4 = height;
    if (height < 0) {
      uVar4 = -height;
      src = src + ~height * src_stride;
      src_stride = -src_stride;
    }
    __ptr = malloc((ulong)(width * 4 + 0x5f));
    puVar8 = (undefined8 *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar1 = (undefined8 *)((long)puVar8 + (ulong)(width * 4 + 0x10));
    *puVar1 = 0;
    puVar1[1] = 0;
    iVar5 = src_stride;
    if (uVar4 == 1) {
      iVar5 = 0;
    }
    iVar6 = 0;
    if (2 < uVar4) {
      iVar6 = src_stride;
    }
    iVar7 = 2;
    pfVar3 = src + iVar5 + iVar6;
    src4 = src + iVar5;
    src0 = src;
    src2 = src;
    do {
      src1 = src;
      src3 = src4;
      src4 = pfVar3;
      GaussCol_F32_C(src0,src1,src2,src3,src4,(float *)(puVar8 + 2),width);
      *(undefined4 *)((long)puVar8 + 0xc) = *(undefined4 *)(puVar8 + 2);
      *(undefined4 *)(puVar8 + 1) = *(undefined4 *)(puVar8 + 2);
      uVar2 = *(undefined4 *)((long)puVar8 + uVar9 * 4 + 0xc);
      *(undefined4 *)((long)puVar8 + uVar9 * 4 + 0x10) = uVar2;
      *(undefined4 *)((long)puVar8 + uVar9 * 4 + 0x14) = uVar2;
      GaussRow_F32_C((float *)(puVar8 + 1),dst,width);
      iVar5 = 0;
      if (iVar7 < (int)(uVar4 - 1)) {
        iVar5 = src_stride;
      }
      dst = dst + dst_stride;
      iVar6 = iVar7 - uVar4;
      iVar7 = iVar7 + 1;
      pfVar3 = src4 + iVar5;
      src = src2;
      src0 = src1;
      src2 = src3;
    } while (iVar6 != 1);
    free(__ptr);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

LIBYUV_API
int GaussPlane_F32(const float* src,
                   int src_stride,
                   float* dst,
                   int dst_stride,
                   int width,
                   int height) {
  int y;
  void (*GaussCol_F32)(const float* src0, const float* src1, const float* src2,
                       const float* src3, const float* src4, float* dst,
                       int width) = GaussCol_F32_C;
  void (*GaussRow_F32)(const float* src, float* dst, int width) =
      GaussRow_F32_C;
  if (!src || !dst || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src = src + (height - 1) * src_stride;
    src_stride = -src_stride;
  }

#if defined(HAS_GAUSSCOL_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussCol_F32 = GaussCol_F32_NEON;
  }
#endif
#if defined(HAS_GAUSSROW_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussRow_F32 = GaussRow_F32_NEON;
  }
#endif
  {
    // 2 pixels on each side, but aligned out to 16 bytes.
    align_buffer_64(rowbuf, (4 + width + 4) * 4);
    memset(rowbuf, 0, 16);
    memset(rowbuf + (4 + width) * 4, 0, 16);
    float* row = (float*)(rowbuf + 16);
    const float* src0 = src;
    const float* src1 = src;
    const float* src2 = src;
    const float* src3 = src2 + ((height > 1) ? src_stride : 0);
    const float* src4 = src3 + ((height > 2) ? src_stride : 0);

    for (y = 0; y < height; ++y) {
      GaussCol_F32(src0, src1, src2, src3, src4, row, width);

      // Extrude edge by 2 floats
      row[-2] = row[-1] = row[0];
      row[width + 1] = row[width] = row[width - 1];

      GaussRow_F32(row - 2, dst, width);

      src0 = src1;
      src1 = src2;
      src2 = src3;
      src3 = src4;
      if ((y + 2) < (height - 1)) {
        src4 += src_stride;
      }
      dst += dst_stride;
    }
    free_aligned_buffer_64(rowbuf);
  }
  return 0;
}